

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::~IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  ~IfcStructuralSurfaceMemberVarying
            ((IfcStructuralSurfaceMemberVarying *)
             (&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
               super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x0 +
             *(long *)(*(long *)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
                                 super_IfcStructuralItem.super_IfcProduct.super_IfcObject + -0x18)))
  ;
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}